

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *pMVar1;
  undefined1 *puVar2;
  undefined8 *puVar3;
  Impl *pIVar4;
  ReadableDirectory **ppRVar5;
  PathPtr prefix;
  String *pSVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Exception *pEVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  Clock *clock;
  InMemoryFileFactory *fileFactory;
  StringPtr *extraout_RDX;
  StringPtr *params;
  Exception *pEVar16;
  size_t sVar17;
  Maybe<kj::String> *pMVar18;
  Filesystem *pFVar19;
  void *__arg;
  void *pvVar20;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
  *displayNameOverride;
  ArrayPtr<const_char> *this_00;
  _Base_ptr p_Var21;
  long lVar22;
  long lVar23;
  _Base_ptr *pp_Var24;
  _Base_ptr p_Var25;
  Own<kj::Directory,_std::nullptr_t> OVar26;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar27;
  ParsedSchema PVar28;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  Path parsed;
  DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  _kjCondition_1;
  StringPtr importDir;
  iterator iter;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  Array<const_kj::ReadableDirectory_*> result;
  StringPtr pathRef;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  DebugExpression<bool> local_219;
  Path local_218;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
  *local_200;
  Path local_1f8;
  undefined1 local_1d8 [32];
  ArrayDisposer *pAStack_1b8;
  String *local_1b0;
  void *pvStack_1a8;
  ArrayDisposer *local_1a0;
  Exception *local_198;
  Exception *local_190;
  _Base_ptr local_188;
  Path *local_180;
  size_t local_178;
  ArrayPtr<const_char> *local_170;
  Exception *local_168;
  Exception *pEStack_160;
  void **ppvStack_158;
  ImportDir local_148;
  undefined1 local_100 [192];
  key_type local_40;
  
  local_178 = displayName.content.size_;
  __arg = (void *)diskPath.content.size_;
  pIVar4 = (this->impl).ptr;
  pMVar1 = &pIVar4->compat;
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
  kj::_::Mutex::lock(&pMVar1->mutex,0);
  local_100._88_8_ = &(pIVar4->compat).value;
  local_100._80_8_ = pMVar1;
  if ((pIVar4->compat).value.ptr.isSet == true) {
    pFVar19 = (pIVar4->compat).value.ptr.field_1.value.fs;
  }
  else {
    kj::newDiskFilesystem();
    pFVar19 = (pIVar4->compat).value.ptr.field_1.value.ownFs.ptr;
    (pIVar4->compat).value.ptr.field_1.value.fs = pFVar19;
    puVar2 = (undefined1 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x20);
    *(undefined4 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x20) = 0;
    *(undefined8 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x28) = 0;
    *(undefined1 **)((long)&(pIVar4->compat).value.ptr.field_1 + 0x30) = puVar2;
    *(undefined1 **)((long)&(pIVar4->compat).value.ptr.field_1 + 0x38) = puVar2;
    *(undefined8 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x40) = 0;
    puVar2 = (undefined1 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x50);
    *(undefined4 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x50) = 0;
    *(undefined8 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x58) = 0;
    *(undefined1 **)((long)&(pIVar4->compat).value.ptr.field_1 + 0x60) = puVar2;
    *(undefined1 **)((long)&(pIVar4->compat).value.ptr.field_1 + 0x68) = puVar2;
    *(undefined8 *)((long)&(pIVar4->compat).value.ptr.field_1 + 0x70) = 0;
    (pIVar4->compat).value.ptr.isSet = true;
  }
  iVar12 = (**pFVar19->_vptr_Filesystem)();
  local_180 = (Path *)CONCAT44(extraout_var,iVar12);
  iVar12 = (*((pIVar4->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem[2])();
  local_100._176_8_ = CONCAT44(extraout_var_00,iVar12);
  kj::PathPtr::eval(&local_218,(PathPtr *)(local_100 + 0xb0),diskPath);
  local_100._48_8_ = displayName.content.ptr;
  local_100._56_8_ = this;
  if (importPath.size_ == 0) {
    displayNameOverride =
         (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
          *)0x0;
    p_Var14 = (_Base_ptr)0x0;
    sVar17 = local_178;
  }
  else {
    local_170 = &(importPath.ptr)->content;
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    pmVar13 = std::
              map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
              ::operator[](&(pIVar4->compat).value.ptr.field_1.value.cachedImportPaths,&local_40);
    if ((Maybe<kj::String> *)pmVar13->size_ == (Maybe<kj::String> *)0x0) {
      __arg = (void *)0x0;
      local_100._40_8_ = pmVar13;
      p_Var14 = (_Base_ptr)
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,importPath.size_,(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
      local_100._16_8_ = &p_Var14->_M_color + importPath.size_ * 2;
      local_100._24_8_ = &kj::_::HeapArrayDisposer::instance;
      local_200 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   *)&(pIVar4->compat).value.ptr.field_1.value.cachedImportDirs;
      local_100._72_8_ = (long)&(pIVar4->compat).value.ptr.field_1 + 0x20;
      local_100._64_8_ = &p_Var14->_M_parent;
      local_100._32_8_ = importPath.size_;
      lVar23 = importPath.size_ << 4;
      lVar22 = 0;
      this_00 = local_170;
      local_188 = p_Var14;
      local_100._0_8_ = p_Var14;
      local_100._8_8_ = p_Var14;
      do {
        iVar15 = std::
                 _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                 ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                         *)local_200,(key_type *)this_00);
        if (iVar15._M_node == (_Base_ptr)local_100._72_8_) {
          kj::PathPtr::eval(&local_1f8,(PathPtr *)(local_100 + 0xb0),(StringPtr)*this_00);
          (*(code *)(local_180->parts).ptr[3].content.disposer)
                    (local_1d8,local_180,local_1f8.parts.ptr,local_1f8.parts.size_);
          params = extraout_RDX;
          if ((Exception *)local_1d8._8_8_ == (Exception *)0x0) {
            clock = kj::nullClock();
            fileFactory = kj::defaultInMemoryFileFactory();
            OVar26 = kj::newInMemoryDirectory((kj *)local_1d8,clock,fileFactory);
            params = (StringPtr *)OVar26.ptr;
          }
          pEVar16 = (Exception *)local_1d8._8_8_;
          uVar8 = local_1d8._0_8_;
          local_100._152_8_ = this_00->ptr;
          local_100._160_8_ = this_00->size_;
          kj::str<kj::StringPtr_const&>(&local_148.pathStr,(kj *)this_00,params);
          pvStack_1a8 = (void *)local_1f8.parts.size_;
          local_1b0 = local_1f8.parts.ptr;
          local_148.path.parts.disposer = local_1f8.parts.disposer;
          local_1f8.parts.ptr = (String *)0x0;
          local_1f8.parts.size_ = 0;
          local_148.dir.disposer = (Disposer *)uVar8;
          local_1d8._0_8_ = local_100._152_8_;
          local_1d8._8_8_ = local_100._160_8_;
          local_1d8._16_8_ = local_148.pathStr.content.ptr;
          local_1d8._24_8_ = local_148.pathStr.content.size_;
          pAStack_1b8 = local_148.pathStr.content.disposer;
          local_148.pathStr.content.ptr = (char *)0x0;
          local_148.pathStr.content.size_ = 0;
          local_1a0 = local_1f8.parts.disposer;
          local_148.path.parts.ptr = (String *)0x0;
          local_148.path.parts.size_ = 0;
          local_198 = (Exception *)uVar8;
          local_190 = pEVar16;
          local_148.dir.ptr = (ReadableDirectory *)0x0;
          pVar27 = std::
                   _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   ::
                   _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                             (local_200,
                              (pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir> *
                              )local_1d8);
          local_219.value = pVar27.second;
          DiskFileCompat::ImportDir::~ImportDir((ImportDir *)(local_1d8 + 0x10));
          DiskFileCompat::ImportDir::~ImportDir(&local_148);
          p_Var14 = local_188;
          pvVar20 = (void *)local_1f8.parts.size_;
          pSVar6 = local_1f8.parts.ptr;
          if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_1d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                       ,0xf6,FAILED,
                       "compat->cachedImportDirs.insert(std::make_pair(pathRef, DiskFileCompat::ImportDir { kj::str(path), kj::mv(parsed), kj::mv(dir) })).second"
                       ,"_kjCondition,",&local_219);
            kj::_::Debug::Fault::fatal((Fault *)local_1d8);
          }
          if (local_1f8.parts.ptr != (String *)0x0) {
            local_1f8.parts.ptr = (String *)0x0;
            local_1f8.parts.size_ = 0;
            (**(local_1f8.parts.disposer)->_vptr_ArrayDisposer)
                      (local_1f8.parts.disposer,pSVar6,0x18,pvVar20,pvVar20,
                       kj::ArrayDisposer::Dispose_<kj::String>::destruct);
            __arg = pvVar20;
          }
        }
        else {
          pEVar16 = (Exception *)iVar15._M_node[3]._M_parent;
        }
        uVar8 = local_100._40_8_;
        *(Exception **)((long)&p_Var14->_M_color + lVar22) = pEVar16;
        local_100._8_8_ = local_100._64_8_ + lVar22;
        this_00 = this_00 + 1;
        lVar22 = lVar22 + 8;
        lVar23 = lVar23 + -0x10;
      } while (lVar23 != 0);
      pMVar18 = (Maybe<kj::String> *)(lVar22 >> 3);
      local_100._112_8_ = &kj::_::HeapArrayDisposer::instance;
      ppRVar5 = *(ReadableDirectory ***)local_100._40_8_;
      local_100._96_8_ = p_Var14;
      local_100._104_8_ = pMVar18;
      if (ppRVar5 != (ReadableDirectory **)0x0) {
        __arg = *(void **)(local_100._40_8_ + 8);
        *(ReadableDirectory ***)local_100._40_8_ = (ReadableDirectory **)0x0;
        *(size_t *)(local_100._40_8_ + 8) = 0;
        (**(*(ArrayDisposer **)(local_100._40_8_ + 0x10))->_vptr_ArrayDisposer)
                  (*(ArrayDisposer **)(local_100._40_8_ + 0x10),ppRVar5,8,__arg,__arg,0);
      }
      *(ReadableDirectory ***)uVar8 = (ReadableDirectory **)p_Var14;
      *(Maybe<kj::String> **)(uVar8 + 8) = pMVar18;
      *(ArrayDisposer **)(uVar8 + 0x10) = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      importPath.size_ = local_100._32_8_;
      local_200 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   *)pMVar18;
    }
    else {
      local_188 = (_Base_ptr)pmVar13->ptr;
      local_200 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   *)pmVar13->size_;
    }
    p_Var25 = (_Base_ptr)((long)&(pIVar4->compat).value.ptr.field_1 + 0x20);
    lVar22 = 0;
    p_Var21 = (_Base_ptr)0x0;
    pp_Var24 = (_Base_ptr *)0x0;
    do {
      puVar3 = (undefined8 *)((long)&local_170->ptr + lVar22);
      local_148.pathStr.content.ptr = (char *)*puVar3;
      local_148.pathStr.content.size_ = puVar3[1];
      local_100._0_8_ =
           std::
           _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
           ::find(&(pIVar4->compat).value.ptr.field_1.value.cachedImportDirs._M_t,
                  (key_type *)&local_148);
      local_1d8._0_8_ = local_100;
      local_1d8._16_8_ = " != ";
      local_1d8._24_8_ = &DAT_00000005;
      pAStack_1b8 = (ArrayDisposer *)
                    CONCAT71(pAStack_1b8._1_7_,(_Base_ptr)local_100._0_8_ != p_Var25);
      if ((_Base_ptr)local_100._0_8_ == p_Var25) {
        local_1d8._8_8_ = p_Var25;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>&>
                  ((Fault *)&local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                   ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","_kjCondition,",
                   (DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    *)local_1d8);
        kj::_::Debug::Fault::fatal((Fault *)&local_1f8);
      }
      prefix.parts.ptr = (String *)((_Rb_tree_node_base *)(local_100._0_8_ + 0x40))->_M_parent;
      prefix.parts.size_ = (size_t)((_Rb_tree_node_base *)(local_100._0_8_ + 0x40))->_M_left;
      local_1d8._0_8_ = local_218.parts.ptr;
      local_1d8._8_8_ = local_218.parts.size_;
      bVar11 = kj::PathPtr::startsWith((PathPtr *)local_1d8,prefix);
      sVar17 = local_178;
      p_Var14 = local_188;
      displayNameOverride = local_200;
      if (bVar11) {
        if (p_Var21 < ((_Base_ptr)(local_100._0_8_ + 0x40))->_M_left) {
          p_Var21 = ((_Base_ptr)(local_100._0_8_ + 0x40))->_M_left;
          pp_Var24 = &((_Base_ptr)(local_100._0_8_ + 0x20))->_M_left;
        }
      }
      lVar22 = lVar22 + 0x10;
    } while (importPath.size_ * 0x10 != lVar22);
    if (pp_Var24 != (_Base_ptr *)0x0) {
      local_180 = (Path *)pp_Var24[7];
      local_148.pathStr.content.ptr =
           (char *)((void **)((long)local_218.parts.ptr + 0x68) + (long)pp_Var24[4] * 3 + -0xd);
      local_148.pathStr.content.size_ = local_218.parts.size_ - (long)pp_Var24[4];
      kj::PathPtr::clone((PathPtr *)local_1d8,(__fn *)&local_148,local_148.pathStr.content.ptr,
                         (int)local_148.pathStr.content.size_,__arg);
      sVar7 = local_218.parts.size_;
      pSVar6 = local_218.parts.ptr;
      if ((Exception *)local_218.parts.ptr != (Exception *)0x0) {
        local_218.parts.ptr = (String *)0x0;
        local_218.parts.size_ = 0;
        (**(local_218.parts.disposer)->_vptr_ArrayDisposer)
                  (local_218.parts.disposer,pSVar6,0x18,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      local_218.parts.ptr = (String *)local_1d8._0_8_;
      local_218.parts.size_ = local_1d8._8_8_;
      local_218.parts.disposer = (ArrayDisposer *)local_1d8._16_8_;
    }
  }
  local_168 = (Exception *)local_218.parts.ptr;
  pEStack_160 = (Exception *)local_218.parts.size_;
  ppvStack_158 = &(local_218.parts.disposer)->_vptr_ArrayDisposer;
  local_218.parts.ptr = (String *)0x0;
  local_218.parts.size_ = 0;
  sVar17 = sVar17 - 1;
  kj::heapString((String *)local_1d8,sVar17);
  if (sVar17 != 0) {
    pEVar16 = (Exception *)local_1d8._8_8_;
    if ((Exception *)local_1d8._8_8_ != (Exception *)0x0) {
      pEVar16 = (Exception *)local_1d8._0_8_;
    }
    memcpy(pEVar16,(void *)local_100._48_8_,sVar17);
  }
  local_100[0x78] = '\x01';
  local_100._128_8_ = local_1d8._0_8_;
  local_100._136_8_ = local_1d8._8_8_;
  local_100._144_8_ = local_1d8._16_8_;
  local_1d8._0_8_ = (Exception *)0x0;
  local_1d8._8_8_ = (_Base_ptr)0x0;
  importPath_00.size_ = (size_t)p_Var14;
  importPath_00.ptr = (ReadableDirectory **)&local_168;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_148,local_180,importPath_00,
             (Maybe<kj::String> *)displayNameOverride);
  PVar28 = parseFile((SchemaParser *)local_100._56_8_,
                     (Own<capnp::SchemaFile,_std::nullptr_t> *)&local_148);
  sVar17 = local_148.pathStr.content.size_;
  if ((long *)local_148.pathStr.content.size_ != (long *)0x0) {
    local_148.pathStr.content.size_ = 0;
    (***(_func_int ***)local_148.pathStr.content.ptr)
              (local_148.pathStr.content.ptr,
               (undefined1 *)(sVar17 + *(long *)(*(long *)sVar17 + -0x10)));
  }
  uVar9 = local_100._136_8_;
  uVar8 = local_100._128_8_;
  if ((local_100[0x78] == '\x01') && ((Exception *)local_100._128_8_ != (Exception *)0x0)) {
    local_100._128_8_ = (Exception *)0x0;
    local_100._136_8_ = (Exception *)0x0;
    (***(_func_int ***)local_100._144_8_)(local_100._144_8_,uVar8,1,uVar9,uVar9,0);
  }
  uVar9 = local_1d8._8_8_;
  uVar8 = local_1d8._0_8_;
  if ((Exception *)local_1d8._0_8_ != (Exception *)0x0) {
    local_1d8._0_8_ = (Exception *)0x0;
    local_1d8._8_8_ = (_Base_ptr)0x0;
    (***(_func_int ***)local_1d8._16_8_)(local_1d8._16_8_,uVar8,1,uVar9,uVar9,0);
  }
  pEVar10 = pEStack_160;
  pEVar16 = local_168;
  if (local_168 != (Exception *)0x0) {
    local_168 = (Exception *)0x0;
    pEStack_160 = (Exception *)0x0;
    (***ppvStack_158)(ppvStack_158,pEVar16,0x18,pEVar10,pEVar10,
                      kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar17 = local_218.parts.size_;
  pSVar6 = local_218.parts.ptr;
  if (local_218.parts.ptr != (String *)0x0) {
    local_218.parts.ptr = (String *)0x0;
    local_218.parts.size_ = 0;
    (**(local_218.parts.disposer)->_vptr_ArrayDisposer)
              (local_218.parts.disposer,pSVar6,0x18,sVar17,sVar17,
               kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((Mutex *)local_100._80_8_ != (Mutex *)0x0) {
    kj::_::Mutex::unlock((Mutex *)local_100._80_8_,EXCLUSIVE,(Waiter *)0x0);
  }
  return PVar28;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_SOME(c, *lock) {
    compat = &c;
  } else {
    compat = &lock->emplace();
  }